

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

int mcpl_buf_is_text(mcpl_buffer_t *buf)

{
  uchar *puVar1;
  uchar *itE;
  uchar *it;
  mcpl_buffer_t *buf_local;
  
  it = (uchar *)buf->buf;
  puVar1 = it + buf->size;
  while( true ) {
    if (it == puVar1) {
      return 1;
    }
    if ((((*it < 9) || (0xd < *it)) && ((*it < 0x20 || (0x7e < *it)))) && (*it < 0x80)) break;
    it = it + 1;
  }
  return 0;
}

Assistant:

MCPL_LOCAL int mcpl_buf_is_text( mcpl_buffer_t* buf ) {
  //We correctly allow ASCII & UTF-8 but not UTF-16 and UTF-32 (by design).
  const unsigned char * it = (unsigned char*)buf->buf;
  const unsigned char * itE = it + buf->size;
  for (; it!=itE; ++it)
    if ( ! ( ( *it >=9 && *it<=13 ) || ( *it >=32 && *it<=126 ) || *it >=128 ) )
      return 0;
  return 1;
}